

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# messages.pb.cc
# Opt level: O3

uint8 * __thiscall
Messages::AddressBook::_InternalSerialize
          (AddressBook *this,uint8 *target,EpsCopyOutputStream *stream)

{
  int iVar1;
  bool bVar2;
  Type *this_00;
  uint uVar3;
  uint uVar4;
  int index;
  uint8 *puVar5;
  uint8 *puVar6;
  
  iVar1 = (this->people_).super_RepeatedPtrFieldBase.current_size_;
  if (iVar1 != 0) {
    index = 0;
    do {
      if (*(uint8 **)stream <= target) {
        target = (uint8 *)google::protobuf::io::EpsCopyOutputStream::EnsureSpaceFallback
                                    ((uchar *)stream);
      }
      this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
                Get<google::protobuf::RepeatedPtrField<Messages::Person>::TypeHandler>
                          (&(this->people_).super_RepeatedPtrFieldBase,index);
      *target = '\n';
      uVar3 = (this_00->_cached_size_).size_.super___atomic_base<int>._M_i;
      if (uVar3 < 0x80) {
        target[1] = (byte)uVar3;
        puVar5 = target + 2;
      }
      else {
        target[1] = (byte)uVar3 | 0x80;
        if (uVar3 < 0x4000) {
          target[2] = (uint8)(uVar3 >> 7);
          puVar5 = target + 3;
        }
        else {
          puVar5 = target + 3;
          uVar3 = uVar3 >> 7;
          do {
            puVar6 = puVar5;
            puVar6[-1] = (byte)uVar3 | 0x80;
            uVar4 = uVar3 >> 7;
            puVar5 = puVar6 + 1;
            bVar2 = 0x3fff < uVar3;
            uVar3 = uVar4;
          } while (bVar2);
          *puVar6 = (uint8)uVar4;
        }
      }
      target = Person::_InternalSerialize(this_00,puVar5,stream);
      index = index + 1;
    } while (index != iVar1);
  }
  if ((*(ulong *)&this->field_0x8 & 1) != 0) {
    puVar5 = (uint8 *)google::protobuf::internal::WireFormat::InternalSerializeUnknownFieldsToArray
                                ((UnknownFieldSet *)
                                 ((*(ulong *)&this->field_0x8 & 0xfffffffffffffffe) + 8),target,
                                 stream);
    return puVar5;
  }
  return target;
}

Assistant:

::PROTOBUF_NAMESPACE_ID::uint8* AddressBook::_InternalSerialize(
    ::PROTOBUF_NAMESPACE_ID::uint8* target, ::PROTOBUF_NAMESPACE_ID::io::EpsCopyOutputStream* stream) const {
  // @@protoc_insertion_point(serialize_to_array_start:Messages.AddressBook)
  ::PROTOBUF_NAMESPACE_ID::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated .Messages.Person people = 1;
  for (unsigned int i = 0,
      n = static_cast<unsigned int>(this->_internal_people_size()); i < n; i++) {
    target = stream->EnsureSpace(target);
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormatLite::
      InternalWriteMessage(1, this->_internal_people(i), target, stream);
  }

  if (PROTOBUF_PREDICT_FALSE(_internal_metadata_.have_unknown_fields())) {
    target = ::PROTOBUF_NAMESPACE_ID::internal::WireFormat::InternalSerializeUnknownFieldsToArray(
        _internal_metadata_.unknown_fields<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(::PROTOBUF_NAMESPACE_ID::UnknownFieldSet::default_instance), target, stream);
  }
  // @@protoc_insertion_point(serialize_to_array_end:Messages.AddressBook)
  return target;
}